

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ProblemType Clasp::detectProblemType(istream *in)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  char *exp;
  ulong uVar4;
  char *fmt;
  
  uVar4 = 1;
LAB_001543b0:
  do {
    uVar2 = std::istream::peek();
    if (uVar2 == 0xffffffff) {
      exp = "false";
      fmt = "bad input stream";
      uVar2 = 0x38;
      uVar4 = 0;
LAB_00154444:
      Potassco::fail(-2,"ProblemType Clasp::detectProblemType(std::istream &)",uVar2,exp,fmt,uVar4);
    }
    iVar3 = uVar2 << 0x18;
    if ((iVar3 != 0x20000000) && (iVar3 != 0x9000000)) {
      cVar1 = (char)uVar2;
      if ((cVar1 == 'a') || ((byte)(cVar1 - 0x30U) < 10)) {
        return Asp;
      }
      if (cVar1 == '*') {
        return Pb;
      }
      if (((uVar2 & 0xff) == 99) || ((uVar2 & 0xff) == 0x70)) {
        return Sat;
      }
      if (iVar3 != 0xa000000) {
        exp = "c == \'\\n\'";
        fmt = "parse error in line %d:%d: \'%c\': unrecognized input format";
        uVar2 = 0x34;
        goto LAB_00154444;
      }
      std::istream::get();
      uVar4 = (ulong)((int)uVar4 + 1);
      goto LAB_001543b0;
    }
    std::istream::get();
  } while( true );
}

Assistant:

ProblemType detectProblemType(std::istream& in) {
	for (std::istream::int_type x, line = 1, pos = 1; (x = in.peek()) != std::char_traits<char>::eof();) {
		char c = static_cast<char>(x);
		if (c == ' ' || c == '\t')  { in.get(); ++pos; continue; }
		if (AspParser::accept(c))   { return Problem_t::Asp; }
		if (DimacsReader::accept(c)){ return Problem_t::Sat; }
		if (OpbReader::accept(c))   { return Problem_t::Pb;  }
		POTASSCO_REQUIRE(c == '\n', "parse error in line %d:%d: '%c': unrecognized input format", (int)line,(int)pos, c);
		in.get();
		++line;
	}
	POTASSCO_REQUIRE(false, "bad input stream");
}